

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestDeprecatedLite::_InternalSerialize
          (TestDeprecatedLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestDeprecatedLite *value;
  anon_union_32_1_493b367e_for_TestDeprecatedLite_3 aVar1;
  uint8_t *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  string_view s;
  
  aVar1 = this->field_0;
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.deprecated_field_,target);
  }
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x8) != (undefined1  [32])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.deprecated_field2_,target);
  }
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.deprecated_field3_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             );
    s._M_str = (char *)*puVar4;
    s._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,s,target);
  }
  if (((undefined1  [32])aVar1 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    value = (this->field_0)._impl_.deprecated_field4_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,&value->super_MessageLite,*(int *)((long)&value->field_0 + 4),target,
                        stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffe;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestDeprecatedLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestDeprecatedLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestDeprecatedLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 deprecated_field = 1 [deprecated = true];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_deprecated_field(), target);
  }

  // int32 deprecated_field2 = 2 [deprecated = true, features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_deprecated_field2(), target);
  }

  // string deprecated_field3 = 3 [deprecated = true];
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_deprecated_field3();
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // .proto2_unittest.TestDeprecatedLite deprecated_field4 = 4 [deprecated = true];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.deprecated_field4_, this_._impl_.deprecated_field4_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestDeprecatedLite)
  return target;
}